

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>::
emplaceRealloc<slang::ast::Scope_const&,slang::syntax::ParameterDeclarationSyntax_const&,slang::syntax::DeclaratorSyntax_const&,bool&,bool&,std::span<slang::syntax::AttributeInstanceSyntax_const*const,18446744073709551615ul>&>
          (SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *this,pointer pos,
          Scope *args,ParameterDeclarationSyntax *args_1,DeclaratorSyntax *args_2,bool *args_3,
          bool *args_4,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *args_5)

{
  ParameterDecl *this_00;
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  pointer p;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar4;
  anon_union_8_3_4d6ead1c_for_ParameterDecl_2 aVar5;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar6;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar7;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar8;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar9;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  pointer pPVar18;
  anon_union_8_3_62382250_for_ParameterDecl_0 *paVar19;
  anon_union_8_3_62382250_for_ParameterDecl_0 *paVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  
  if (this->len == 0x1ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar23 = this->len + 1;
  uVar3 = this->cap;
  if (uVar23 < uVar3 * 2) {
    uVar23 = uVar3 * 2;
  }
  if (0x1ffffffffffffff - uVar3 < uVar3) {
    uVar23 = 0x1ffffffffffffff;
  }
  lVar24 = (long)pos - (long)this->data_;
  paVar20 = (anon_union_8_3_62382250_for_ParameterDecl_0 *)operator_new(uVar23 << 6);
  this_00 = (ParameterDecl *)((long)paVar20 + lVar24);
  ast::DefinitionSymbol::ParameterDecl::ParameterDecl
            (this_00,args,args_1,args_2,*args_3,*args_4,*args_5);
  p = this->data_;
  lVar21 = this->len * 0x40;
  lVar22 = (long)p + (lVar21 - (long)pos);
  pPVar18 = p;
  paVar19 = paVar20;
  if (lVar22 == 0) {
    if (this->len != 0) {
      lVar22 = 0;
      do {
        puVar2 = (undefined8 *)((long)&p->field_0 + lVar22);
        uVar11 = *puVar2;
        uVar12 = puVar2[1];
        puVar2 = (undefined8 *)((long)&(p->name)._M_len + lVar22);
        uVar13 = *puVar2;
        uVar14 = puVar2[1];
        puVar2 = (undefined8 *)(&(p->location).field_0x0 + lVar22);
        uVar15 = *puVar2;
        uVar16 = puVar2[1];
        puVar2 = (undefined8 *)((long)&(p->attributes)._M_extent._M_extent_value + lVar22);
        uVar17 = puVar2[1];
        puVar1 = (undefined8 *)((long)paVar20 + lVar22 + 0x30);
        *puVar1 = *puVar2;
        puVar1[1] = uVar17;
        puVar2 = (undefined8 *)((long)paVar20 + lVar22 + 0x20);
        *puVar2 = uVar15;
        puVar2[1] = uVar16;
        puVar2 = (undefined8 *)((long)paVar20 + lVar22 + 0x10);
        *puVar2 = uVar13;
        puVar2[1] = uVar14;
        *(undefined8 *)((long)paVar20 + lVar22) = uVar11;
        ((undefined8 *)((long)paVar20 + lVar22))[1] = uVar12;
        lVar22 = lVar22 + 0x40;
      } while (lVar21 != lVar22);
    }
  }
  else {
    for (; pPVar18 != pos; pPVar18 = pPVar18 + 1) {
      aVar4 = pPVar18->field_0;
      aVar5 = pPVar18->field_1;
      aVar6 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar18->name)._M_len;
      aVar7 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar18->name)._M_str;
      aVar8 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&pPVar18->location;
      aVar9 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar18->attributes)._M_ptr;
      aVar10 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&pPVar18->isTypeParam;
      paVar19[6] = (anon_union_8_3_62382250_for_ParameterDecl_0)
                   (pPVar18->attributes)._M_extent._M_extent_value;
      paVar19[7] = aVar10;
      paVar19[4] = aVar8;
      paVar19[5] = aVar9;
      paVar19[2] = aVar6;
      paVar19[3] = aVar7;
      *paVar19 = aVar4;
      *(anon_union_8_3_4d6ead1c_for_ParameterDecl_2 *)(paVar19 + 1) = aVar5;
      paVar19 = paVar19 + 8;
    }
    memcpy((void *)((long)paVar20 + lVar24 + 0x40),pos,(lVar22 - 0x40U & 0xffffffffffffffc0) + 0x40)
    ;
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar23;
  this->data_ = (pointer)paVar20;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}